

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

void dxil_spv::propagate_precise
               (UnorderedSet<const_LLVMBC::Instruction_*> *cache,Instruction *value)

{
  Instruction *pIVar1;
  uint uVar2;
  size_type sVar3;
  PHINode *this;
  Value *pVVar4;
  uint local_3c;
  uint n_1;
  uint i_1;
  uint n;
  uint i;
  PHINode *phi;
  Instruction *local_18;
  Instruction *value_local;
  UnorderedSet<const_LLVMBC::Instruction_*> *cache_local;
  
  local_18 = value;
  value_local = (Instruction *)cache;
  sVar3 = std::
          unordered_set<const_LLVMBC::Instruction_*,_std::hash<const_LLVMBC::Instruction_*>,_std::equal_to<const_LLVMBC::Instruction_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>_>
          ::count(cache,&local_18);
  if (sVar3 == 0) {
    std::
    unordered_set<const_LLVMBC::Instruction_*,_std::hash<const_LLVMBC::Instruction_*>,_std::equal_to<const_LLVMBC::Instruction_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>_>
    ::insert((unordered_set<const_LLVMBC::Instruction_*,_std::hash<const_LLVMBC::Instruction_*>,_std::equal_to<const_LLVMBC::Instruction_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>_>
              *)value_local,&local_18);
    this = LLVMBC::dyn_cast<LLVMBC::PHINode>(&local_18->super_Value);
    if (this == (PHINode *)0x0) {
      local_3c = 0;
      uVar2 = LLVMBC::Instruction::getNumOperands(local_18);
      for (; pIVar1 = value_local, local_3c < uVar2; local_3c = local_3c + 1) {
        pVVar4 = LLVMBC::Instruction::getOperand(local_18,local_3c);
        mark_precise((UnorderedSet<const_LLVMBC::Instruction_*> *)pIVar1,pVVar4);
      }
    }
    else {
      i_1 = 0;
      uVar2 = LLVMBC::PHINode::getNumIncomingValues(this);
      for (; pIVar1 = value_local, i_1 < uVar2; i_1 = i_1 + 1) {
        pVVar4 = LLVMBC::PHINode::getIncomingValue(this,i_1);
        mark_precise((UnorderedSet<const_LLVMBC::Instruction_*> *)pIVar1,pVVar4);
      }
    }
  }
  return;
}

Assistant:

static void propagate_precise(UnorderedSet<const llvm::Instruction *> &cache, const llvm::Instruction *value)
{
	if (cache.count(value) != 0)
		return;
	cache.insert(value);

	if (const auto *phi = llvm::dyn_cast<llvm::PHINode>(value))
	{
		for (unsigned i = 0, n = phi->getNumIncomingValues(); i < n; i++)
			mark_precise(cache, phi->getIncomingValue(i));
	}
	else
	{
		for (unsigned i = 0, n = value->getNumOperands(); i < n; i++)
			mark_precise(cache, value->getOperand(i));
	}
}